

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

void priBaseMod(word *mods,word *a,size_t n,size_t count)

{
  word wVar1;
  word *in_RCX;
  long in_RDI;
  word t;
  size_t num;
  size_t j;
  size_t i;
  size_t local_38;
  ulong w;
  word *n_00;
  
  n_00 = (word *)0x0;
  for (w = 0; n_00 < in_RCX && w < 0xc6; w = w + 1) {
    local_38 = _prods[w].num;
    wVar1 = zzModW(in_RCX,(size_t)n_00,w);
    for (; local_38 != 0 && n_00 < in_RCX; n_00 = (word *)((long)n_00 + 1)) {
      *(ulong *)(in_RDI + (long)n_00 * 8) = wVar1 % _base[(long)n_00];
      local_38 = local_38 - 1;
    }
  }
  for (; n_00 < in_RCX; n_00 = (word *)((long)n_00 + 1)) {
    wVar1 = zzModW(in_RCX,(size_t)n_00,w);
    *(word *)(in_RDI + (long)n_00 * 8) = wVar1;
  }
  return;
}

Assistant:

void priBaseMod(word mods[], const word a[], size_t n, size_t count)
{
	size_t i, j;
	// pre
	ASSERT(wwIsValid(a, n));
	ASSERT(count <= priBaseSize());
	ASSERT(wwIsValid(mods, count));
	// пробегаем произведения простых из факторной базы
	for (i = j = 0; i < count && j < COUNT_OF(_prods); ++j)
	{
		size_t num = _prods[j].num;
		// t <- a mod _base[i] * ... * _base[i + num - 1]
		word t = zzModW(a, n, _prods[j].prod);
		// mods[i] <- t mod _base[i]
		while (num-- && i < count)
			mods[i] = t % _base[i], ++i;
	}
	// пробегаем оставшиеся простые из факторной базы
	for (; i < count; ++i)
		mods[i] = zzModW(a, n, _base[i]);
}